

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_ne_fop_FFF(DisasContext_conflict8 *dc,int rd,int rs1,int rs2,
                   _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict8 *gen)

{
  TCGContext_conflict8 *pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 v;
  
  pTVar1 = dc->uc->tcg_ctx;
  pTVar2 = gen_load_fpr_F(dc,rs1);
  pTVar3 = gen_load_fpr_F(dc,rs2);
  v = gen_dest_fpr_F(dc);
  (*gen)(pTVar1,v,pTVar2,pTVar3);
  gen_store_fpr_F(dc,rd,v);
  return;
}

Assistant:

static inline void gen_ne_fop_FFF(DisasContext *dc, int rd, int rs1, int rs2,
                                  void (*gen)(TCGContext *,TCGv_i32, TCGv_i32, TCGv_i32))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGv_i32 dst, src1, src2;

    src1 = gen_load_fpr_F(dc, rs1);
    src2 = gen_load_fpr_F(dc, rs2);
    dst = gen_dest_fpr_F(dc);

    gen(tcg_ctx,dst, src1, src2);

    gen_store_fpr_F(dc, rd, dst);
}